

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::SimpleNode::AnnotatePass1
          (SimpleNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  undefined1 *puVar1;
  NodeTag NVar2;
  code *pcVar3;
  bool bVar4;
  CharSet<char16_t> *pCVar5;
  undefined4 *puVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  
  (this->super_Node).thisConsumes.lower = 0;
  (this->super_Node).thisConsumes.upper = 0;
  *(uint *)&(this->super_Node).field_0xc =
       (*(uint *)&(this->super_Node).field_0xc & 0xffffc3ce) +
       ((int)CONCAT71(in_register_00000011,parentNotInLoop) << 10 |
        (int)CONCAT71(in_register_00000009,parentAtLeastOnce) << 0xb |
        (int)CONCAT71(in_register_00000081,parentNotSpeculative) << 0xc |
       (int)CONCAT71(in_register_00000089,parentNotNegated) << 0xd) + 0x30;
  NVar2 = (this->super_Node).tag;
  if (NVar2 == EOL) {
    (this->super_Node).features = 4;
    if ((compiler->program->flags & MultilineRegexFlag) == NoRegexFlags) {
      pCVar5 = StandardChars<char16_t>::GetEmptySet(compiler->standardChars);
    }
    else {
      pCVar5 = StandardChars<char16_t>::GetNewlineSet(compiler->standardChars);
    }
  }
  else {
    if (NVar2 != BOL) {
      if (NVar2 == Empty) {
        (this->super_Node).features = 1;
        pCVar5 = StandardChars<char16_t>::GetEmptySet(compiler->standardChars);
        (this->super_Node).firstSet = pCVar5;
        puVar1 = &(this->super_Node).field_0xc;
        *puVar1 = *puVar1 | 2;
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1ae,"(false)","false");
      if (bVar4) {
        *puVar6 = 0;
        return;
      }
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    (this->super_Node).features = 2;
    pCVar5 = StandardChars<char16_t>::GetFullSet(compiler->standardChars);
  }
  (this->super_Node).firstSet = pCVar5;
  puVar1 = &(this->super_Node).field_0xc;
  *puVar1 = *puVar1 & 0xfd;
  return;
}

Assistant:

void SimpleNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        isFirstExact = false;
        thisConsumes.Exact(0);
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
        switch (tag)
        {
        case Empty:
            features = HasEmpty;
            firstSet = compiler.standardChars->GetEmptySet();
            isThisIrrefutable = true;
            break;
        case BOL:
            features = HasBOL;
            firstSet = compiler.standardChars->GetFullSet();
            isThisIrrefutable = false;
            break;
        case EOL:
            features = HasEOL;
            if ((compiler.program->flags & MultilineRegexFlag) != 0)
                firstSet = compiler.standardChars->GetNewlineSet();
            else
                firstSet = compiler.standardChars->GetEmptySet();
            isThisIrrefutable = false;
            break;
        default:
            Assert(false);
        }
    }